

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

string_t * __thiscall
el::base::utils::DateTime::formatTime_abi_cxx11_
          (string_t *__return_storage_ptr__,DateTime *this,unsigned_long_long time,
          TimestampUnit timestampUnit)

{
  long lVar1;
  double dVar2;
  char *__s;
  ostream *poVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  double *pdVar7;
  undefined1 auVar8 [16];
  stringstream_t ss;
  stringstream local_1a0 [16];
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  uVar5 = time & 0xffffffff;
  uVar6 = uVar5;
  if ((uint)time < 5) {
    lVar1 = uVar5 + (4 - (uint)time);
    pdVar7 = (double *)(consts::kTimeFormats + uVar5 * 0x10);
    do {
      auVar8._8_4_ = (int)((ulong)this >> 0x20);
      auVar8._0_8_ = this;
      auVar8._12_4_ = 0x45300000;
      dVar2 = *pdVar7;
      uVar6 = uVar5;
      if (((auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0) <= dVar2) ||
         (((dVar2 == 1000.0 && (!NAN(dVar2))) && ((float)this / 1000.0 < 1.9)))) break;
      this = (DateTime *)
             ((ulong)this /
             (ulong)((long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2));
      uVar5 = uVar5 + 1;
      pdVar7 = pdVar7 + 2;
      uVar6 = lVar1 + 1;
    } while (uVar5 != 5);
  }
  __s = *(char **)(consts::kTimeFormats + uVar6 * 0x10 + 8);
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  poVar3 = ::std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_190);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  sVar4 = strlen(__s);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  ::std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

base::type::string_t DateTime::formatTime(unsigned long long time, base::TimestampUnit timestampUnit) {
  base::type::EnumType start = static_cast<base::type::EnumType>(timestampUnit);
  const base::type::char_t* unit = base::consts::kTimeFormats[start].unit;
  for (base::type::EnumType i = start; i < base::consts::kTimeFormatsCount - 1; ++i) {
    if (time <= base::consts::kTimeFormats[i].value) {
      break;
    }
    if (base::consts::kTimeFormats[i].value == 1000.0f && time / 1000.0f < 1.9f) {
      break;
    }
    time /= static_cast<decltype(time)>(base::consts::kTimeFormats[i].value);
    unit = base::consts::kTimeFormats[i + 1].unit;
  }
  base::type::stringstream_t ss;
  ss << time << " " << unit;
  return ss.str();
}